

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

string * __thiscall
cpplog::Logger::toString_abi_cxx11_
          (string *__return_storage_ptr__,Logger *this,time_point timestamp)

{
  char *pcVar1;
  ulong uVar2;
  allocator local_421;
  time_t time;
  array<char,_1024UL> buff;
  
  time = (long)timestamp.__d.__r / 1000000000;
  memset(&buff,0,0x400);
  pcVar1 = ctime_r(&time,buff._M_elems);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_421);
  uVar2 = std::__cxx11::string::rfind((char)__return_storage_ptr__,10);
  std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Logger::toString(std::chrono::system_clock::time_point timestamp) const
{
    auto time = std::chrono::system_clock::to_time_t(timestamp);
#ifdef _POSIX_C_SOURCE
    // ctime is not thread-safe so use thread-safe alternative
    std::array<char, 1024> buff = {0};
    std::string text = ctime_r(&time, buff.data());
#else
    std::string text = ctime(&time);
#endif
    // required, since ctime (asctime) append a new-line
    text.erase(text.find_last_of('\n'), 1);
    return text;
}